

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

string_type * __thiscall
booster::locale::impl_icu::converter_impl<char>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,converter_impl<char> *this,conversion_type how,
          char_type *begin,char_type *end,int flags)

{
  pointer pcVar1;
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  string local_c0;
  icu_std_converter<char,_1> local_a0;
  icu_std_converter<char,_1> local_60;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar1 = (this->encoding_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (this->encoding_)._M_string_length);
  icu_std_converter<char,_1>::icu_std_converter(&local_60,&local_c0,cvt_skip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  icu_std_converter<char,_1>::icu(&local_a0,(char_type *)&local_60,begin);
  switch(how) {
  case normalization:
    anon_unknown_12::normalize_string((UnicodeString *)&local_a0,flags);
    break;
  case upper_case:
    icu_70::UnicodeString::toUpper((Locale *)&local_a0);
    break;
  case lower_case:
    icu_70::UnicodeString::toLower((Locale *)&local_a0);
    break;
  case case_folding:
    icu_70::UnicodeString::foldCase((uint)&local_a0);
    break;
  case title_case:
    icu_70::UnicodeString::toTitle((BreakIterator *)&local_a0,(Locale *)0x0);
  }
  icu_std_converter<char,1>::std_abi_cxx11_
            (__return_storage_ptr__,&local_60,(UnicodeString *)&local_a0);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.charset_._M_dataplus._M_p != &local_60.charset_.field_2) {
    operator_delete(local_60.charset_._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int flags = 0) const
        {
            icu_std_converter<char_type> cvt(encoding_);
            icu::UnicodeString str=cvt.icu(begin,end);
            switch(how) {
            case converter_base::normalization:
                normalize_string(str,flags);
                break;
            case converter_base::upper_case:
                str.toUpper(locale_);
                break;
            case converter_base::lower_case:
                str.toLower(locale_);
                break;
            case converter_base::title_case:
                str.toTitle(0,locale_);
                break;
            case converter_base::case_folding:
                str.foldCase();
                break;
            default:
                ;
            }
            return cvt.std(str);
        }